

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O1

void amrex::AmrMesh::ProjPeriodic(BoxList *blout,Box *domain,Array<int,_3> *is_per)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BoxList tmp;
  BoxList blorig;
  BoxList local_70;
  BoxList local_50;
  
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_50,
             (vector<amrex::Box,_std::allocator<amrex::Box>_> *)blout);
  local_50.btype.itype = (blout->btype).itype;
  iVar3 = -1;
  do {
    if (iVar3 == 0) {
LAB_005c6c8d:
      iVar1 = -1;
      do {
        if (iVar1 == 0) {
LAB_005c6cc2:
          iVar2 = -1;
          do {
            if (iVar2 == 0) {
LAB_005c6ceb:
              std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_70,
                         (vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_50);
              local_70.btype.itype = local_50.btype.itype;
              BoxList::intersect(&local_70,domain);
              BoxList::catenate(blout,&local_70);
              if ((iVar2 != 0) && (is_per->_M_elems[2] != 0)) {
                BoxList::shift(&local_50,2,
                               (~(domain->bigend).vect[2] + (domain->smallend).vect[2]) * iVar2);
              }
              if (local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_70.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_70.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_70.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else if (is_per->_M_elems[2] != 0) {
              BoxList::shift(&local_50,2,
                             (((domain->bigend).vect[2] - (domain->smallend).vect[2]) + 1) * iVar2);
              goto LAB_005c6ceb;
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 != 2);
          if ((iVar1 != 0) && (is_per->_M_elems[1] != 0)) {
            BoxList::shift(&local_50,1,
                           (~(domain->bigend).vect[1] + (domain->smallend).vect[1]) * iVar1);
          }
        }
        else if (is_per->_M_elems[1] != 0) {
          BoxList::shift(&local_50,1,
                         (((domain->bigend).vect[1] - (domain->smallend).vect[1]) + 1) * iVar1);
          goto LAB_005c6cc2;
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 != 2);
      if ((iVar3 != 0) && (is_per->_M_elems[0] != 0)) {
        BoxList::shift(&local_50,0,(~(domain->bigend).vect[0] + (domain->smallend).vect[0]) * iVar3)
        ;
      }
    }
    else if (is_per->_M_elems[0] != 0) {
      BoxList::shift(&local_50,0,
                     (((domain->bigend).vect[0] - (domain->smallend).vect[0]) + 1) * iVar3);
      goto LAB_005c6c8d;
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == 2) {
      if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void
AmrMesh::ProjPeriodic (BoxList& blout, const Box& domain,
                       Array<int,AMREX_SPACEDIM> const& is_per)
{
    //
    // Add periodic translates to blout.
    //

    BoxList blorig(blout);

    int nist,njst,nkst;
    int niend,njend,nkend;
    nist = njst = nkst = 0;
    niend = njend = nkend = 0;
    AMREX_D_TERM( nist , =njst , =nkst ) = -1;
    AMREX_D_TERM( niend , =njend , =nkend ) = +1;

    int ri,rj,rk;
    for (ri = nist; ri <= niend; ri++)
    {
        if (ri != 0 && !is_per[0])
            continue;
        if (ri != 0 && is_per[0])
            blorig.shift(0,ri*domain.length(0));
        for (rj = njst; rj <= njend; rj++)
        {
            if (rj != 0 && !is_per[1])
                continue;
            if (rj != 0 && is_per[1])
                blorig.shift(1,rj*domain.length(1));
            for (rk = nkst; rk <= nkend; rk++)
            {
                if (rk != 0 && !is_per[2])
                    continue;
                if (rk != 0 && is_per[2])
                    blorig.shift(2,rk*domain.length(2));

                BoxList tmp(blorig);
                tmp.intersect(domain);
                blout.catenate(tmp);

                if (rk != 0 && is_per[2])
                    blorig.shift(2,-rk*domain.length(2));
            }
            if (rj != 0 && is_per[1])
                blorig.shift(1,-rj*domain.length(1));
        }
        if (ri != 0 && is_per[0])
            blorig.shift(0,-ri*domain.length(0));
    }
}